

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O3

bool spdlog::details::os::create_dir(filename_t *path)

{
  int iVar1;
  size_type __n;
  ulong __pos;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> subdir;
  stat buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  stat local_c0;
  
  iVar1 = stat((path->_M_dataplus)._M_p,&local_c0);
  if (iVar1 == 0) {
    bVar2 = true;
  }
  else if (path->_M_string_length == 0) {
    bVar2 = false;
  }
  else {
    __pos = 0;
    do {
      __n = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(path,"/",__pos,1);
      if (__n == 0xffffffffffffffff) {
        __n = path->_M_string_length;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_e0,path,0,__n);
      if (((local_e0._M_string_length == 0) ||
          (iVar1 = stat(local_e0._M_dataplus._M_p,&local_c0), iVar1 == 0)) ||
         (iVar1 = mkdir(local_e0._M_dataplus._M_p,0x1ed), iVar1 == 0)) {
        __pos = __n + 1;
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
    } while ((bVar2 & __pos < path->_M_string_length) != 0);
  }
  return bVar2;
}

Assistant:

SPDLOG_INLINE bool create_dir(const filename_t &path) {
    if (path_exists(path)) {
        return true;
    }

    if (path.empty()) {
        return false;
    }

    size_t search_offset = 0;
    do {
        auto token_pos = path.find_first_of(folder_seps_filename, search_offset);
        // treat the entire path as a folder if no folder separator not found
        if (token_pos == filename_t::npos) {
            token_pos = path.size();
        }

        auto subdir = path.substr(0, token_pos);
#ifdef _WIN32
        // if subdir is just a drive letter, add a slash e.g. "c:"=>"c:\",
        // otherwise path_exists(subdir) returns false (issue #3079)
        const bool is_drive = subdir.length() == 2 && subdir[1] == ':';
        if (is_drive) {
            subdir += '\\';
            token_pos++;
        }
#endif

        if (!subdir.empty() && !path_exists(subdir) && !mkdir_(subdir)) {
            return false;  // return error if failed creating dir
        }
        search_offset = token_pos + 1;
    } while (search_offset < path.size());

    return true;
}